

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-algebra.cc
# Opt level: O2

normal3d * tinyusdz::vcross(normal3d *a,normal3d *b)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  normal3d *in_RDI;
  
  dVar1 = b->x;
  dVar2 = a->x;
  dVar3 = a->y;
  dVar4 = a->z;
  dVar5 = b->y;
  dVar6 = b->z;
  in_RDI->x = dVar6 * dVar3 - dVar4 * dVar5;
  in_RDI->y = dVar1 * dVar4 - dVar2 * dVar6;
  in_RDI->z = dVar2 * dVar5 - dVar1 * dVar3;
  return in_RDI;
}

Assistant:

value::normal3d vcross(const value::normal3d &a, const value::normal3d &b)
{
  value::normal3d n;
  n[0] = a[1] * b[2] - a[2] * b[1];
  n[1] = a[2] * b[0] - a[0] * b[2];
  n[2] = a[0] * b[1] - a[1] * b[0];

  return n;
}